

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUtility.cpp
# Opt level: O3

uint32_t GmmLib::Utility::GmmGetNumPlanes(GMM_RESOURCE_FORMAT Format)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = 3;
  uVar2 = Format - GMM_FORMAT_I420;
  if (uVar2 < 0x32) {
    if ((0x6002001fbfU >> ((ulong)uVar2 & 0x3f) & 1) != 0) {
      return 3;
    }
    if ((0x20000001ee000U >> ((ulong)uVar2 & 0x3f) & 1) != 0) {
      return 2;
    }
  }
  if (Format != GMM_FORMAT_BGRP) {
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

uint32_t GMM_STDCALL GmmGetNumPlanes(GMM_RESOURCE_FORMAT Format)
        {
            uint32_t Planes = 1;

            switch(Format)
            {
                // YUV Planar Formats
                case GMM_FORMAT_BGRP:
                case GMM_FORMAT_IMC1:
                case GMM_FORMAT_IMC2:
                case GMM_FORMAT_IMC3:
                case GMM_FORMAT_IMC4:
                case GMM_FORMAT_I420:
                case GMM_FORMAT_IYUV:
                case GMM_FORMAT_MFX_JPEG_YUV411:
                case GMM_FORMAT_MFX_JPEG_YUV411R:
                case GMM_FORMAT_MFX_JPEG_YUV420:
                case GMM_FORMAT_MFX_JPEG_YUV422H:
                case GMM_FORMAT_MFX_JPEG_YUV422V:
                case GMM_FORMAT_MFX_JPEG_YUV444:
                case GMM_FORMAT_RGBP:
                case GMM_FORMAT_YV12:
                case GMM_FORMAT_YVU9:
                    Planes = 3;
                    break;
                // YUV Hybrid Formats - GMM treats as Planar
                case GMM_FORMAT_NV11:
                case GMM_FORMAT_NV12:
                case GMM_FORMAT_NV21:
                case GMM_FORMAT_P010:
                case GMM_FORMAT_P012:
                case GMM_FORMAT_P016:
                case GMM_FORMAT_P208:
                case GMM_FORMAT_P216:
                    Planes = 2;
                    break;
                default:
                    Planes = 1;
                    break;
            }
            return Planes;
        }